

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles2::Functional::LocalStructTests::init()::Eval_parameter::eval(deqp::gls::
     ShaderEvalContext__(ShaderEvalContext *c)

{
  long lVar1;
  float afStack_2c [2];
  undefined8 local_24;
  float local_1c;
  int local_18 [6];
  
  local_24 = *(undefined8 *)(c->coords).m_data;
  local_1c = (c->coords).m_data[2];
  local_18[2] = 0;
  local_18[3] = 1;
  local_18[4] = 2;
  lVar1 = 2;
  do {
    (c->color).m_data[local_18[lVar1]] = afStack_2c[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }